

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O1

void SetGenericPropertyPtr<Assimp::SharedPostProcessInfo::Base>
               (map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
                *list,char *szName,Base *value,bool *bWasExisting)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  iterator __position;
  bool bVar8;
  pair<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*> local_30;
  
  if (szName == (char *)0x0) {
    __assert_fail("nullptr != szName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/GenericProperty.h"
                  ,0x5d,
                  "void SetGenericPropertyPtr(std::map<unsigned int, T *> &, const char *, T *, bool *) [T = Assimp::SharedPostProcessInfo::Base]"
                 );
  }
  sVar5 = strlen(szName);
  uVar4 = (uint)sVar5;
  uVar7 = 0;
  if (3 < uVar4) {
    uVar3 = uVar4 >> 2;
    uVar7 = 0;
    do {
      uVar7 = (*(ushort *)szName + uVar7) * 0x10000 ^
              ((uint)(byte)*(ushort *)((long)szName + 2) << 0xb |
              (uint)*(byte *)((long)szName + 3) << 0x13) ^ *(ushort *)szName + uVar7;
      szName = (char *)((long)szName + 4);
      uVar7 = (uVar7 >> 0xb) + uVar7;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  switch(uVar4 & 3) {
  case 0:
    goto switchD_003b00d0_caseD_0;
  case 1:
    uVar7 = uVar7 + (int)(char)*(ushort *)szName;
    uVar4 = uVar7 * 0x400 ^ uVar7;
    uVar7 = uVar4 >> 1;
    break;
  case 2:
    uVar7 = (*(ushort *)szName + uVar7) * 0x800 ^ *(ushort *)szName + uVar7;
    uVar7 = (uVar7 >> 0x11) + uVar7;
    goto switchD_003b00d0_caseD_0;
  case 3:
    uVar4 = (*(ushort *)szName + uVar7) * 0x10000 ^
            (int)(char)*(ushort *)((long)szName + 2) << 0x12 ^ *(ushort *)szName + uVar7;
    uVar7 = uVar4 >> 0xb;
  }
  uVar7 = uVar7 + uVar4;
switchD_003b00d0_caseD_0:
  uVar7 = uVar7 * 8 ^ uVar7;
  uVar7 = (uVar7 >> 5) + uVar7;
  uVar7 = uVar7 * 0x10 ^ uVar7;
  uVar7 = (uVar7 >> 0x11) + uVar7;
  uVar7 = uVar7 * 0x2000000 ^ uVar7;
  local_30.first = (uVar7 >> 6) + uVar7;
  p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
  p_Var2 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar8]) {
    bVar8 = p_Var2[1]._M_color < local_30.first;
    if (!bVar8) {
      p_Var6 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (__position._M_node = p_Var6, local_30.first < p_Var6[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    if (bWasExisting != (bool *)0x0) {
      *bWasExisting = false;
    }
    local_30.second = value;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
    ::_M_emplace_unique<std::pair<unsigned_int,Assimp::SharedPostProcessInfo::Base*>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
                *)list,&local_30);
  }
  else {
    p_Var2 = __position._M_node[1]._M_parent;
    if (p_Var2 != (_Base_ptr)value) {
      if (p_Var2 != (_Base_ptr)0x0) {
        (*(*(_func_int ***)p_Var2)[1])();
      }
      __position._M_node[1]._M_parent = (_Base_ptr)value;
    }
    if (value == (Base *)0x0) {
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>,std::_Select1st<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::SharedPostProcessInfo::Base*>>>
                          *)list,__position);
    }
    if (bWasExisting != (bool *)0x0) {
      *bWasExisting = true;
    }
  }
  return;
}

Assistant:

inline
void SetGenericPropertyPtr(std::map< unsigned int, T* >& list,
        const char* szName, T* value, bool* bWasExisting = nullptr ) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T*>::iterator it = list.find(hash);
    if (it == list.end())   {
        if (bWasExisting) {
            *bWasExisting = false;
        }

        list.insert(std::pair<unsigned int,T*>( hash, value ));
        return;
    }
    if ((*it).second != value)  {
        delete (*it).second;
        (*it).second = value;
    }
    if (!value) {
        list.erase(it);
    }
    if (bWasExisting) {
        *bWasExisting = true;
    }
}